

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void ts_lexer__get_lookahead(Lexer *self)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  code *pcVar7;
  
  uVar1 = (self->current_position).bytes - self->chunk_start;
  uVar6 = self->chunk_size - uVar1;
  if (uVar6 == 0) {
    self->lookahead_size = 1;
    (self->data).lookahead = 0;
  }
  else {
    pcVar7 = utf16_iterate;
    if ((self->input).encoding == TSInputEncodingUTF8) {
      pcVar7 = utf8proc_iterate;
    }
    uVar2 = (*pcVar7)(self->chunk + uVar1,uVar6,self);
    self->lookahead_size = uVar2;
    iVar3 = (self->data).lookahead;
    if (uVar6 < 4 && iVar3 == -1) {
      uVar2 = (self->current_position).bytes;
      self->chunk_start = uVar2;
      pcVar4 = (*(self->input).read)
                         ((self->input).payload,uVar2,(self->current_position).extent,
                          &self->chunk_size);
      pcVar5 = "";
      if (self->chunk_size != 0) {
        pcVar5 = pcVar4;
      }
      self->chunk = pcVar5;
      uVar2 = (*pcVar7)(pcVar5,self->chunk_size,self);
      self->lookahead_size = uVar2;
      iVar3 = (self->data).lookahead;
    }
    if (iVar3 == -1) {
      self->lookahead_size = 1;
    }
  }
  return;
}

Assistant:

static void ts_lexer__get_lookahead(Lexer *self) {
  uint32_t position_in_chunk = self->current_position.bytes - self->chunk_start;
  const uint8_t *chunk = (const uint8_t *)self->chunk + position_in_chunk;
  uint32_t size = self->chunk_size - position_in_chunk;

  if (size == 0) {
    self->lookahead_size = 1;
    self->data.lookahead = '\0';
    return;
  }

  DecodeFunction decode =
    self->input.encoding == TSInputEncodingUTF8 ? utf8proc_iterate : utf16_iterate;

  self->lookahead_size = decode(chunk, size, &self->data.lookahead);

  // If this chunk ended in the middle of a multi-byte character,
  // try again with a fresh chunk.
  if (self->data.lookahead == -1 && size < 4) {
    ts_lexer__get_chunk(self);
    chunk = (const uint8_t *)self->chunk;
    size = self->chunk_size;
    self->lookahead_size = decode(chunk, size, &self->data.lookahead);
  }

  if (self->data.lookahead == -1) {
    self->lookahead_size = 1;
  }
}